

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

void __thiscall sector_t::TransferSpecial(sector_t *this,sector_t *model)

{
  int iVar1;
  short sVar2;
  
  this->special = model->special;
  iVar1 = model->damageamount;
  this->damagetype = (FName)(model->damagetype).super_FName;
  this->damageamount = iVar1;
  sVar2 = model->leakydamage;
  this->damageinterval = model->damageinterval;
  this->leakydamage = sVar2;
  this->Flags = model->Flags & 0x7b0 | this->Flags & 0xfffff84f;
  return;
}

Assistant:

void sector_t::TransferSpecial(sector_t *model)
{
	special = model->special;
	damageamount = model->damageamount;
	damagetype = model->damagetype;
	damageinterval = model->damageinterval;
	leakydamage = model->leakydamage;
	Flags = (Flags&~SECF_SPECIALFLAGS) | (model->Flags & SECF_SPECIALFLAGS);
}